

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::objectivec::FieldName_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FieldDescriptor *field)

{
  string *__return_storage_ptr___00;
  bool bVar1;
  allocator local_d1;
  string local_d0;
  allocator local_a9;
  string local_a8;
  StringPiece local_88;
  StringPiece local_78 [2];
  undefined1 local_58 [8];
  string result;
  string name;
  FieldDescriptor *field_local;
  
  __return_storage_ptr___00 = (string *)((long)&result.field_2 + 8);
  (anonymous_namespace)::NameFromFieldDescriptor_abi_cxx11_
            (__return_storage_ptr___00,(_anonymous_namespace_ *)this,field);
  anon_unknown_0::UnderscoresToCamelCase((string *)local_58,__return_storage_ptr___00,false);
  bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)this);
  if ((!bVar1) || (bVar1 = FieldDescriptor::is_map((FieldDescriptor *)this), bVar1)) {
    stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
              (local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_58);
    stringpiece_internal::StringPiece::StringPiece(&local_88,"Array");
    bVar1 = HasSuffixString(local_78[0],local_88);
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)local_58,"_p");
    }
  }
  else {
    std::__cxx11::string::operator+=((string *)local_58,"Array");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"",&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"_p",&local_d1);
  anon_unknown_0::SanitizeNameForObjC
            (__return_storage_ptr__,&local_a8,(string *)local_58,&local_d0,(string *)0x0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(result.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string FieldName(const FieldDescriptor* field) {
  const std::string name = NameFromFieldDescriptor(field);
  std::string result = UnderscoresToCamelCase(name, false);
  if (field->is_repeated() && !field->is_map()) {
    // Add "Array" before do check for reserved worlds.
    result += "Array";
  } else {
    // If it wasn't repeated, but ends in "Array", force on the _p suffix.
    if (HasSuffixString(result, "Array")) {
      result += "_p";
    }
  }
  return SanitizeNameForObjC("", result, "_p", NULL);
}